

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QHeaderView * __thiscall QAccessibleTableHeaderCell::headerView(QAccessibleTableHeaderCell *this)

{
  QTableView *pQVar1;
  QTreeView *this_00;
  long in_RDI;
  QTreeView *tv_1;
  QTableView *tv;
  QHeaderView *header;
  QTableView *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  
  local_10 = (QHeaderView *)0x0;
  ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7fa108);
  pQVar1 = qobject_cast<QTableView_const*>((QObject *)0x7fa110);
  if (pQVar1 == (QTableView *)0x0) {
    ::QPointer::operator_cast_to_QAbstractItemView_((QPointer<QAbstractItemView> *)0x7fa156);
    this_00 = qobject_cast<QTreeView_const*>((QObject *)0x7fa15e);
    if (this_00 != (QTreeView *)0x0) {
      local_10 = QTreeView::header(this_00);
    }
  }
  else if (*(int *)(in_RDI + 0x1c) == 1) {
    local_10 = QTableView::horizontalHeader(in_stack_ffffffffffffffe0);
  }
  else {
    local_10 = QTableView::verticalHeader(in_stack_ffffffffffffffe0);
  }
  return local_10;
}

Assistant:

QHeaderView *QAccessibleTableHeaderCell::headerView() const
{
    QHeaderView *header = nullptr;
    if (false) {
#if QT_CONFIG(tableview)
    } else if (const QTableView *tv = qobject_cast<const QTableView*>(view)) {
        if (orientation == Qt::Horizontal) {
            header = tv->horizontalHeader();
        } else {
            header = tv->verticalHeader();
        }
#endif
#if QT_CONFIG(treeview)
    } else if (const QTreeView *tv = qobject_cast<const QTreeView*>(view)) {
        header = tv->header();
#endif
    }
    return header;
}